

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O2

int32_t get_child_list_count(miniscript_node_t *node)

{
  int iVar1;
  miniscript_node_t **ppmVar2;
  
  ppmVar2 = &node->child;
  iVar1 = 0;
  while( true ) {
    if (*ppmVar2 == (miniscript_node_t *)0x0) break;
    iVar1 = iVar1 + 1;
    ppmVar2 = &(*ppmVar2)->next;
  }
  return iVar1;
}

Assistant:

static int32_t get_child_list_count(struct miniscript_node_t *node)
{
    int32_t ret = 0;
    struct miniscript_node_t *chain = node->child;
    while (chain != NULL) {
        ++ret;
        chain = chain->next;
    }
    return ret;
}